

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5ConfigParse
              (Fts5Global *pGlobal,sqlite3 *db,int nArg,char **azArg,Fts5Config **ppOut,char **pzErr
              )

{
  int iVar1;
  int iVar2;
  Fts5Config *pFVar3;
  char **ppcVar4;
  char *pcVar5;
  size_t sVar6;
  int *piVar7;
  char *pcVar8;
  byte bVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  byte *__s;
  long lVar14;
  long lVar15;
  bool bVar16;
  int local_b0;
  int bDummy;
  char **local_a8;
  Fts5Config *local_a0;
  char *zTwo;
  long local_90;
  int bMustBeCol;
  Fts5Tokenizer **local_80;
  char *zOne;
  undefined8 uStack_70;
  char **local_68;
  char **local_60;
  char *local_58;
  char *local_50;
  fts5_tokenizer **local_48;
  Fts5Global *local_40;
  Fts5Config **local_38;
  
  local_b0 = 0;
  local_a8 = pzErr;
  local_40 = pGlobal;
  pFVar3 = (Fts5Config *)sqlite3_malloc(0xa8);
  *ppOut = pFVar3;
  if (pFVar3 == (Fts5Config *)0x0) {
    return 7;
  }
  memset(&pFVar3->zDb,0,0xa0);
  pFVar3->db = db;
  pFVar3->iCookie = -1;
  lVar14 = (long)nArg;
  ppcVar4 = (char **)sqlite3Fts5MallocZero(&local_b0,lVar14 * 9);
  pFVar3->azCol = ppcVar4;
  pFVar3->abUnindexed = (u8 *)(ppcVar4 + lVar14);
  local_90 = lVar14;
  pcVar5 = sqlite3Fts5Strndup(&local_b0,azArg[1],-1);
  pFVar3->zDb = pcVar5;
  local_60 = azArg;
  pcVar5 = sqlite3Fts5Strndup(&local_b0,azArg[2],-1);
  pFVar3->zName = pcVar5;
  pFVar3->bColumnsize = 1;
  pFVar3->eDetail = 0;
  local_a0 = pFVar3;
  iVar2 = local_b0;
  if (local_b0 == 0) {
    iVar1 = sqlite3_stricmp(pcVar5,"rank");
    iVar2 = 0;
    if (iVar1 == 0) {
      pcVar5 = sqlite3_mprintf("reserved fts5 table name: %s");
      *local_a8 = pcVar5;
      local_b0 = 1;
      iVar2 = 1;
    }
  }
  local_80 = &pFVar3->pTok;
  local_48 = &pFVar3->pTokApi;
  local_50 = "content";
  lVar15 = local_90;
  ppcVar4 = local_60;
  local_38 = ppOut;
  for (lVar14 = 3; (iVar2 == 0 && (lVar14 < lVar15)); lVar14 = lVar14 + 1) {
    zOne = (char *)0x0;
    zTwo = (char *)0x0;
    bMustBeCol = 0;
    pcVar5 = fts5ConfigGobbleWord(&local_b0,ppcVar4[lVar14],&zOne,&bMustBeCol);
    pcVar5 = fts5ConfigSkipWhitespace(pcVar5);
    pcVar13 = (char *)0x1;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else if (*pcVar5 == '=') {
      pcVar13 = (char *)0x0;
      pcVar5 = pcVar5 + 1;
      if (bMustBeCol != 0) {
        pcVar5 = pcVar13;
      }
    }
    pcVar5 = fts5ConfigSkipWhitespace(pcVar5);
    iVar2 = local_b0;
    if (pcVar5 == (char *)0x0) {
      if (local_b0 == 0) {
LAB_0018b24c:
        pcVar5 = sqlite3_mprintf("parse error in \"%s\"");
        *local_a8 = pcVar5;
        local_b0 = 1;
        iVar2 = local_b0;
      }
    }
    else if (*pcVar5 == '\0') {
      if (local_b0 == 0) goto LAB_0018b275;
    }
    else {
      pcVar5 = fts5ConfigGobbleWord(&local_b0,pcVar5,&zTwo,&bDummy);
      if (pcVar5 == (char *)0x0) {
        bVar16 = true;
      }
      else {
        bVar16 = *pcVar5 != '\0';
      }
      iVar2 = local_b0;
      if (local_b0 == 0) {
        if (bVar16) goto LAB_0018b24c;
LAB_0018b275:
        pcVar8 = zOne;
        pcVar5 = zTwo;
        if ((char)pcVar13 == '\0') {
          __s = (byte *)zTwo;
          if (zTwo == (char *)0x0) {
            __s = (byte *)0x1c7aeb;
          }
          bDummy = 0;
          sVar6 = strlen(zOne);
          iVar1 = (int)sVar6;
          iVar2 = sqlite3_strnicmp("prefix",pcVar8,iVar1);
          pFVar3 = local_a0;
          if (iVar2 == 0) {
            piVar7 = local_a0->aPrefix;
            if (piVar7 == (int *)0x0) {
              piVar7 = (int *)sqlite3Fts5MallocZero(&bDummy,0x7c);
              pFVar3->aPrefix = piVar7;
              ppcVar4 = local_60;
              iVar2 = bDummy;
              if (bDummy != 0) goto LAB_0018b7cf;
            }
            bVar10 = 0;
            while( true ) {
              __s = __s + -1;
              do {
                bVar9 = __s[1];
                __s = __s + 1;
              } while (bVar9 == 0x20);
              if ((bool)(~bVar10 & 1 | bVar9 != 0x2c)) {
                if (bVar9 == 0) goto LAB_0018b7c4;
              }
              else {
                do {
                  bVar9 = __s[1];
                  __s = __s + 1;
                } while (bVar9 == 0x20);
              }
              if ((byte)(bVar9 - 0x3a) < 0xf6) {
                pcVar5 = "malformed prefix=... directive";
                goto LAB_0018b5d4;
              }
              if ((long)local_a0->nPrefix == 0x1f) {
                pcVar5 = sqlite3_mprintf("too many prefix indexes (max %d)");
                goto LAB_0018b5db;
              }
              for (iVar2 = 0; (('/' < (char)bVar9 && (bVar9 < 0x3a)) && (iVar2 < 1000));
                  iVar2 = (uint)bVar10 + iVar2 * 10) {
                bVar10 = bVar9 - 0x30;
                bVar9 = __s[1];
                __s = __s + 1;
              }
              if (iVar2 - 1000U < 0xfffffc19) break;
              piVar7[local_a0->nPrefix] = iVar2;
              local_a0->nPrefix = local_a0->nPrefix + 1;
              bVar10 = 1;
            }
            pcVar5 = "prefix length out of range (max 999)";
            goto LAB_0018b5d4;
          }
          iVar2 = sqlite3_strnicmp("tokenize",pcVar8,iVar1);
          if (iVar2 == 0) {
            sVar6 = strlen((char *)__s);
            ppcVar4 = (char **)sqlite3Fts5MallocZero(&bDummy,sVar6 * 8 + 8);
            pcVar5 = (char *)sqlite3Fts5MallocZero(&bDummy,sVar6 * 2 + 2);
            iVar2 = bDummy;
            if (ppcVar4 != (char **)0x0 && pcVar5 != (char *)0x0) {
              if (*local_80 == (Fts5Tokenizer *)0x0) {
                lVar11 = 0;
                local_68 = ppcVar4;
                local_58 = pcVar5;
                while (ppcVar4 = local_68, __s != (byte *)0x0) {
                  if (*__s == 0) {
                    iVar2 = sqlite3Fts5GetTokenizer
                                      (local_40,local_68,(int)lVar11,local_80,local_48,local_a8);
                    pcVar5 = local_58;
                    goto LAB_0018b77d;
                  }
                  pcVar13 = fts5ConfigSkipWhitespace((char *)__s);
                  if (*pcVar13 == '\'') {
                    pcVar8 = fts5ConfigSkipLiteral(pcVar13);
                  }
                  else {
                    pcVar8 = fts5ConfigSkipBareword(pcVar13);
                  }
                  if (pcVar8 == (char *)0x0) {
                    __s = (byte *)0x0;
                  }
                  else {
                    memcpy(pcVar5,pcVar13,(long)pcVar8 - (long)pcVar13);
                    local_68[lVar11] = pcVar5;
                    sqlite3Fts5Dequote(pcVar5);
                    pcVar5 = pcVar5 + ((long)pcVar8 - (long)pcVar13) + 1;
                    __s = (byte *)fts5ConfigSkipWhitespace(pcVar8);
                  }
                  lVar11 = lVar11 + 1;
                  lVar15 = local_90;
                }
                pcVar5 = sqlite3_mprintf("parse error in tokenize directive");
                *local_a8 = pcVar5;
                iVar2 = 1;
                pcVar5 = local_58;
              }
              else {
                pcVar13 = sqlite3_mprintf("multiple tokenize=... directives");
                *local_a8 = pcVar13;
                iVar2 = 1;
              }
            }
LAB_0018b77d:
            sqlite3_free(ppcVar4);
            sqlite3_free(pcVar5);
            ppcVar4 = local_60;
          }
          else {
            iVar2 = sqlite3_strnicmp("content",pcVar8,iVar1);
            pFVar3 = local_a0;
            if (iVar2 == 0) {
              if (local_a0->eContent != 0) {
                pcVar5 = "multiple content=... directives";
                goto LAB_0018b5d4;
              }
              if (*__s == 0) {
                local_a0->eContent = 1;
LAB_0018b7c4:
                ppcVar4 = local_60;
                iVar2 = 0;
              }
              else {
                local_a0->eContent = 2;
                pcVar5 = sqlite3Fts5Mprintf(&bDummy,"%Q.%Q",local_a0->zDb,__s);
                pFVar3->zContent = pcVar5;
                ppcVar4 = local_60;
                iVar2 = bDummy;
              }
            }
            else {
              iVar2 = sqlite3_strnicmp("content_rowid",pcVar8,iVar1);
              pFVar3 = local_a0;
              if (iVar2 == 0) {
                if (local_a0->zContentRowid == (char *)0x0) {
                  pcVar5 = sqlite3Fts5Strndup(&bDummy,(char *)__s,-1);
                  pFVar3->zContentRowid = pcVar5;
                  ppcVar4 = local_60;
                  iVar2 = bDummy;
                  goto LAB_0018b7cf;
                }
                pcVar5 = "multiple content_rowid=... directives";
LAB_0018b5d4:
                pcVar5 = sqlite3_mprintf(pcVar5);
              }
              else {
                iVar2 = sqlite3_strnicmp("columnsize",pcVar8,iVar1);
                if (iVar2 == 0) {
                  if (((*__s & 0xfe) == 0x30) && (__s[1] == 0)) {
                    local_a0->bColumnsize = (uint)(*__s == 0x31);
                    goto LAB_0018b7c4;
                  }
                  pcVar5 = "malformed columnsize=... directive";
                  goto LAB_0018b5d4;
                }
                iVar2 = sqlite3_strnicmp("detail",pcVar8,iVar1);
                ppcVar4 = local_a8;
                if (iVar2 == 0) {
                  sVar6 = strlen((char *)__s);
                  iVar2 = -1;
                  for (lVar15 = 8; lVar15 != 0x38; lVar15 = lVar15 + 0x10) {
                    iVar1 = sqlite3_strnicmp(*(char **)(&UNK_001fb308 + lVar15),(char *)__s,
                                             (int)sVar6);
                    if (iVar1 == 0) {
                      if (-1 < iVar2) goto LAB_0018b799;
                      iVar2 = *(int *)((long)&DAT_001fb310 + lVar15);
                    }
                  }
                  local_a0->eDetail = iVar2;
                  if (iVar2 < 0) {
LAB_0018b799:
                    pcVar5 = sqlite3_mprintf("malformed detail=... directive");
                    *ppcVar4 = pcVar5;
                    lVar15 = local_90;
                    ppcVar4 = local_60;
                    iVar2 = 1;
                  }
                  else {
                    lVar15 = local_90;
                    ppcVar4 = local_60;
                    iVar2 = 0;
                  }
                  goto LAB_0018b7cf;
                }
                pcVar5 = sqlite3_mprintf("unrecognized option: \"%.*s\"",sVar6 & 0xffffffff,pcVar8);
              }
LAB_0018b5db:
              *local_a8 = pcVar5;
              ppcVar4 = local_60;
              iVar2 = 1;
            }
          }
        }
        else {
          iVar2 = sqlite3_stricmp(zOne,"rank");
          if ((iVar2 == 0) || (iVar2 = sqlite3_stricmp(pcVar8,"rowid"), iVar2 == 0)) {
            pcVar13 = "reserved fts5 column name: %s";
            pcVar5 = pcVar8;
LAB_0018b3b9:
            pcVar5 = sqlite3_mprintf(pcVar13,pcVar5);
            *local_a8 = pcVar5;
            iVar2 = 1;
          }
          else {
            iVar2 = 0;
            if (pcVar5 != (char *)0x0) {
              iVar1 = sqlite3StrICmp(pcVar5,"unindexed");
              if (iVar1 != 0) {
                pcVar13 = "unrecognized column option: %s";
                goto LAB_0018b3b9;
              }
              local_a0->abUnindexed[local_a0->nCol] = '\x01';
            }
          }
          iVar1 = local_a0->nCol;
          local_a0->nCol = iVar1 + 1;
          local_a0->azCol[iVar1] = pcVar8;
          zOne = (char *)0x0;
          ppcVar4 = local_60;
        }
      }
    }
LAB_0018b7cf:
    local_b0 = iVar2;
    iVar2 = local_b0;
    sqlite3_free(zOne);
    sqlite3_free(zTwo);
  }
  pFVar3 = local_a0;
  if ((iVar2 != 0) ||
     ((*local_80 == (Fts5Tokenizer *)0x0 &&
      (iVar2 = sqlite3Fts5GetTokenizer(local_40,(char **)0x0,0,local_80,local_48,(char **)0x0),
      pFVar3 = local_a0, local_b0 = iVar2, iVar2 != 0)))) goto LAB_0018b7f4;
  if (local_a0->zContent == (char *)0x0) {
    if (local_a0->eContent != 0) {
      if (local_a0->bColumnsize == 0) goto LAB_0018b836;
      local_50 = "docsize";
    }
    pcVar5 = sqlite3Fts5Mprintf(&local_b0,"%Q.\'%q_%s\'",local_a0->zDb,local_a0->zName,local_50);
    local_a0->zContent = pcVar5;
    pFVar3 = local_a0;
    iVar2 = local_b0;
    if (local_b0 != 0) goto LAB_0018b7f4;
  }
LAB_0018b836:
  pFVar3 = local_a0;
  pcVar5 = local_a0->zContentRowid;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = sqlite3Fts5Strndup(&local_b0,"rowid",-1);
    pFVar3->zContentRowid = pcVar5;
    iVar2 = local_b0;
    if (local_b0 != 0) goto LAB_0018b7f4;
  }
  zTwo = (char *)((ulong)zTwo & 0xffffffff00000000);
  zOne = (char *)0x0;
  uStack_70._0_4_ = 0;
  uStack_70._4_4_ = 0;
  sqlite3Fts5BufferAppendPrintf((int *)&zTwo,(Fts5Buffer *)&zOne,"T.%Q",pcVar5);
  if (pFVar3->eContent != 1) {
    for (uVar12 = 0; (long)uVar12 < (long)pFVar3->nCol; uVar12 = uVar12 + 1) {
      if (pFVar3->eContent == 2) {
        sqlite3Fts5BufferAppendPrintf
                  ((int *)&zTwo,(Fts5Buffer *)&zOne,", T.%Q",pFVar3->azCol[uVar12]);
      }
      else {
        sqlite3Fts5BufferAppendPrintf
                  ((int *)&zTwo,(Fts5Buffer *)&zOne,", T.c%d",uVar12 & 0xffffffff);
      }
      pFVar3 = local_a0;
    }
  }
  pFVar3->zContentExprlist = zOne;
  iVar2 = (int)zTwo;
  if ((int)zTwo == 0) {
    return 0;
  }
LAB_0018b7f4:
  sqlite3Fts5ConfigFree(pFVar3);
  *local_38 = (Fts5Config *)0x0;
  return iVar2;
}

Assistant:

static int sqlite3Fts5ConfigParse(
  Fts5Global *pGlobal,
  sqlite3 *db,
  int nArg,                       /* Number of arguments */
  const char **azArg,             /* Array of nArg CREATE VIRTUAL TABLE args */
  Fts5Config **ppOut,             /* OUT: Results of parse */
  char **pzErr                    /* OUT: Error message */
){
  int rc = SQLITE_OK;             /* Return code */
  Fts5Config *pRet;               /* New object to return */
  int i;
  sqlite3_int64 nByte;

  *ppOut = pRet = (Fts5Config*)sqlite3_malloc(sizeof(Fts5Config));
  if( pRet==0 ) return SQLITE_NOMEM;
  memset(pRet, 0, sizeof(Fts5Config));
  pRet->db = db;
  pRet->iCookie = -1;

  nByte = nArg * (sizeof(char*) + sizeof(u8));
  pRet->azCol = (char**)sqlite3Fts5MallocZero(&rc, nByte);
  pRet->abUnindexed = (u8*)&pRet->azCol[nArg];
  pRet->zDb = sqlite3Fts5Strndup(&rc, azArg[1], -1);
  pRet->zName = sqlite3Fts5Strndup(&rc, azArg[2], -1);
  pRet->bColumnsize = 1;
  pRet->eDetail = FTS5_DETAIL_FULL;
#ifdef SQLITE_DEBUG
  pRet->bPrefixIndex = 1;
#endif
  if( rc==SQLITE_OK && sqlite3_stricmp(pRet->zName, FTS5_RANK_NAME)==0 ){
    *pzErr = sqlite3_mprintf("reserved fts5 table name: %s", pRet->zName);
    rc = SQLITE_ERROR;
  }

  for(i=3; rc==SQLITE_OK && i<nArg; i++){
    const char *zOrig = azArg[i];
    const char *z;
    char *zOne = 0;
    char *zTwo = 0;
    int bOption = 0;
    int bMustBeCol = 0;

    z = fts5ConfigGobbleWord(&rc, zOrig, &zOne, &bMustBeCol);
    z = fts5ConfigSkipWhitespace(z);
    if( z && *z=='=' ){
      bOption = 1;
      z++;
      if( bMustBeCol ) z = 0;
    }
    z = fts5ConfigSkipWhitespace(z);
    if( z && z[0] ){
      int bDummy;
      z = fts5ConfigGobbleWord(&rc, z, &zTwo, &bDummy);
      if( z && z[0] ) z = 0;
    }

    if( rc==SQLITE_OK ){
      if( z==0 ){
        *pzErr = sqlite3_mprintf("parse error in \"%s\"", zOrig);
        rc = SQLITE_ERROR;
      }else{
        if( bOption ){
          rc = fts5ConfigParseSpecial(pGlobal, pRet, zOne, zTwo?zTwo:"", pzErr);
        }else{
          rc = fts5ConfigParseColumn(pRet, zOne, zTwo, pzErr);
          zOne = 0;
        }
      }
    }

    sqlite3_free(zOne);
    sqlite3_free(zTwo);
  }

  /* If a tokenizer= option was successfully parsed, the tokenizer has
  ** already been allocated. Otherwise, allocate an instance of the default
  ** tokenizer (unicode61) now.  */
  if( rc==SQLITE_OK && pRet->pTok==0 ){
    rc = fts5ConfigDefaultTokenizer(pGlobal, pRet);
  }

  /* If no zContent option was specified, fill in the default values. */
  if( rc==SQLITE_OK && pRet->zContent==0 ){
    const char *zTail = 0;
    assert( pRet->eContent==FTS5_CONTENT_NORMAL 
         || pRet->eContent==FTS5_CONTENT_NONE 
    );
    if( pRet->eContent==FTS5_CONTENT_NORMAL ){
      zTail = "content";
    }else if( pRet->bColumnsize ){
      zTail = "docsize";
    }

    if( zTail ){
      pRet->zContent = sqlite3Fts5Mprintf(
          &rc, "%Q.'%q_%s'", pRet->zDb, pRet->zName, zTail
      );
    }
  }

  if( rc==SQLITE_OK && pRet->zContentRowid==0 ){
    pRet->zContentRowid = sqlite3Fts5Strndup(&rc, "rowid", -1);
  }

  /* Formulate the zContentExprlist text */
  if( rc==SQLITE_OK ){
    rc = fts5ConfigMakeExprlist(pRet);
  }

  if( rc!=SQLITE_OK ){
    sqlite3Fts5ConfigFree(pRet);
    *ppOut = 0;
  }
  return rc;
}